

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disjunctiveMonotone.c
# Opt level: O1

Aig_Man_t *
createDisjunctiveMonotoneTester
          (Aig_Man_t *pAig,aigPoIndices *aigPoIndicesArg,
          antecedentConsequentVectorsStruct *anteConseVectors,int *startMonotonePropPo)

{
  Vec_Int_t *pVVar1;
  Vec_Int_t *pVVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  Aig_Man_t *p;
  size_t sVar6;
  char *__s;
  Aig_Obj_t *pAVar7;
  uint *__ptr;
  void *pvVar8;
  Aig_Obj_t *pAVar9;
  Vec_Ptr_t *pVVar10;
  ulong uVar11;
  uint *__ptr_00;
  uint *__ptr_01;
  Aig_Obj_t *pAVar12;
  Aig_Obj_t *pAVar13;
  ulong uVar14;
  uint uVar15;
  Aig_Obj_t *pAVar16;
  int iVar17;
  int iVar18;
  long lVar19;
  int iVar20;
  uint uVar21;
  long lVar22;
  int local_74;
  Aig_Obj_t *local_50;
  
  pVVar1 = anteConseVectors->attrConsequentCandidates;
  if (pVVar1 == (Vec_Int_t *)0x0) {
    p = (Aig_Man_t *)0x0;
  }
  else {
    uVar4 = aigPoIndicesArg->attrPendingSignalIndex;
    pVVar2 = anteConseVectors->attrAntecedents;
    p = Aig_ManStart(pAig->vObjs->nSize);
    sVar6 = strlen(pAig->pName);
    __s = (char *)malloc(sVar6 + 0xb);
    p->pName = __s;
    iVar18 = 0;
    sprintf(__s,"%s_%s",pAig->pName,"monotone");
    p->pSpec = (char *)0x0;
    pAig->pConst1->field_5 = (anon_union_8_3_a781e0d5_for_Aig_Obj_t__13)p->pConst1;
    if (0 < pAig->nTruePis) {
      lVar22 = 0;
      do {
        if (pAig->vCis->nSize <= lVar22) goto LAB_005b032d;
        pvVar8 = pAig->vCis->pArray[lVar22];
        pAVar7 = Aig_ObjCreateCi(p);
        *(Aig_Obj_t **)((long)pvVar8 + 0x28) = pAVar7;
        lVar22 = lVar22 + 1;
      } while (lVar22 < pAig->nTruePis);
    }
    if (0 < pAig->nRegs) {
      iVar18 = 0;
      do {
        uVar3 = pAig->nTruePis + iVar18;
        if (((int)uVar3 < 0) || (pAig->vCis->nSize <= (int)uVar3)) goto LAB_005b032d;
        pvVar8 = pAig->vCis->pArray[uVar3];
        iVar18 = iVar18 + 1;
        pAVar7 = Aig_ObjCreateCi(p);
        *(Aig_Obj_t **)((long)pvVar8 + 0x28) = pAVar7;
      } while (iVar18 < pAig->nRegs);
    }
    pAVar7 = Aig_ObjCreateCi(p);
    uVar3 = pVVar1->nSize;
    __ptr = (uint *)malloc(0x10);
    uVar15 = 8;
    if (6 < uVar3 - 1) {
      uVar15 = uVar3;
    }
    __ptr[1] = 0;
    *__ptr = uVar15;
    if (uVar15 == 0) {
      pvVar8 = (void *)0x0;
    }
    else {
      pvVar8 = malloc((long)(int)uVar15 << 3);
    }
    *(void **)(__ptr + 2) = pvVar8;
    if (pVVar1->nSize < 1) {
      local_74 = 1;
    }
    else {
      iVar17 = 0;
      do {
        local_74 = iVar17;
        pAVar9 = Aig_ObjCreateCi(p);
        uVar3 = __ptr[1];
        uVar15 = *__ptr;
        if (uVar3 == uVar15) {
          if ((int)uVar15 < 0x10) {
            if (*(void **)(__ptr + 2) == (void *)0x0) {
              pvVar8 = malloc(0x80);
            }
            else {
              pvVar8 = realloc(*(void **)(__ptr + 2),0x80);
            }
            uVar21 = 0x10;
          }
          else {
            uVar21 = uVar15 * 2;
            if ((int)uVar21 <= (int)uVar15) goto LAB_005afcb0;
            if (*(void **)(__ptr + 2) == (void *)0x0) {
              pvVar8 = malloc((ulong)uVar15 << 4);
            }
            else {
              pvVar8 = realloc(*(void **)(__ptr + 2),(ulong)uVar15 << 4);
            }
          }
          *(void **)(__ptr + 2) = pvVar8;
          *__ptr = uVar21;
        }
LAB_005afcb0:
        __ptr[1] = uVar3 + 1;
        *(Aig_Obj_t **)(*(long *)(__ptr + 2) + (long)(int)uVar3 * 8) = pAVar9;
        iVar17 = local_74 + 1;
      } while (iVar17 < pVVar1->nSize);
      local_74 = local_74 + 2;
    }
    pVVar10 = pAig->vObjs;
    if (0 < pVVar10->nSize) {
      lVar22 = 0;
      do {
        pvVar8 = pVVar10->pArray[lVar22];
        if ((pvVar8 != (void *)0x0) && (0xfffffffd < (*(uint *)((long)pvVar8 + 0x18) & 7) - 7)) {
          if (((ulong)pvVar8 & 1) != 0) goto LAB_005b034c;
          uVar11 = *(ulong *)((long)pvVar8 + 8) & 0xfffffffffffffffe;
          if (uVar11 == 0) {
            pAVar9 = (Aig_Obj_t *)0x0;
          }
          else {
            pAVar9 = (Aig_Obj_t *)
                     ((ulong)((uint)*(ulong *)((long)pvVar8 + 8) & 1) ^ *(ulong *)(uVar11 + 0x28));
          }
          uVar11 = *(ulong *)((long)pvVar8 + 0x10) & 0xfffffffffffffffe;
          if (uVar11 == 0) {
            pAVar16 = (Aig_Obj_t *)0x0;
          }
          else {
            pAVar16 = (Aig_Obj_t *)
                      ((ulong)((uint)*(ulong *)((long)pvVar8 + 0x10) & 1) ^
                      *(ulong *)(uVar11 + 0x28));
          }
          pAVar9 = Aig_And(p,pAVar9,pAVar16);
          *(Aig_Obj_t **)((long)pvVar8 + 0x28) = pAVar9;
        }
        lVar22 = lVar22 + 1;
        pVVar10 = pAig->vObjs;
      } while (lVar22 < pVVar10->nSize);
    }
    uVar3 = aigPoIndicesArg->attrSafetyInvarIndex;
    if ((ulong)uVar3 == 0xffffffff) {
      local_50 = p->pConst1;
    }
    else {
      if (((int)uVar3 < 0) || (pAig->vCos->nSize <= (int)uVar3)) goto LAB_005b032d;
      uVar11 = *(ulong *)((long)pAig->vCos->pArray[uVar3] + 8);
      if ((uVar11 & 1) == 0) {
        local_50 = *(Aig_Obj_t **)(uVar11 + 0x28);
      }
      else {
        local_50 = (Aig_Obj_t *)(*(ulong *)((uVar11 & 0xfffffffffffffffe) + 0x28) ^ 1);
      }
    }
    if (((int)uVar4 < 0) || (pAig->vCos->nSize <= (int)uVar4)) {
LAB_005b032d:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                    ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
    }
    uVar11 = *(ulong *)((long)pAig->vCos->pArray[uVar4] + 8);
    if ((uVar11 & 1) == 0) {
      pAVar9 = *(Aig_Obj_t **)(uVar11 + 0x28);
    }
    else {
      pAVar9 = (Aig_Obj_t *)(*(ulong *)((uVar11 & 0xfffffffffffffffe) + 0x28) ^ 1);
    }
    pAVar7 = Aig_And(p,pAVar9,pAVar7);
    pAVar16 = (Aig_Obj_t *)((ulong)p->pConst1 ^ 1);
    if ((pVVar2 != (Vec_Int_t *)0x0) && (0 < pVVar2->nSize)) {
      lVar22 = 0;
      do {
        iVar17 = pVVar2->pArray[lVar22];
        if (((long)iVar17 < 0) || (pAig->vCos->nSize <= iVar17)) goto LAB_005b032d;
        uVar11 = *(ulong *)((long)pAig->vCos->pArray[iVar17] + 8);
        if ((uVar11 & 1) == 0) {
          pAVar12 = *(Aig_Obj_t **)(uVar11 + 0x28);
        }
        else {
          pAVar12 = (Aig_Obj_t *)(*(ulong *)((uVar11 & 0xfffffffffffffffe) + 0x28) ^ 1);
        }
        pAVar16 = Aig_Or(p,pAVar12,pAVar16);
        lVar22 = lVar22 + 1;
      } while (lVar22 < pVVar2->nSize);
    }
    uVar4 = pVVar1->nSize;
    __ptr_00 = (uint *)malloc(0x10);
    uVar3 = 8;
    if (6 < uVar4 - 1) {
      uVar3 = uVar4;
    }
    __ptr_00[1] = 0;
    *__ptr_00 = uVar3;
    if (uVar3 == 0) {
      pvVar8 = (void *)0x0;
    }
    else {
      pvVar8 = malloc((long)(int)uVar3 * 8);
    }
    *(void **)(__ptr_00 + 2) = pvVar8;
    __ptr_01 = (uint *)malloc(0x10);
    __ptr_01[1] = 0;
    *__ptr_01 = uVar3;
    if (uVar3 == 0) {
      pvVar8 = (void *)0x0;
    }
    else {
      pvVar8 = malloc((long)(int)uVar3 << 3);
    }
    *(void **)(__ptr_01 + 2) = pvVar8;
    if (0 < pVVar1->nSize) {
      lVar22 = 0;
      do {
        iVar17 = pVVar1->pArray[lVar22];
        if (((long)iVar17 < 0) || (pAig->vCos->nSize <= iVar17)) goto LAB_005b032d;
        uVar11 = *(ulong *)((long)pAig->vCos->pArray[iVar17] + 8);
        if ((uVar11 & 1) == 0) {
          pAVar12 = *(Aig_Obj_t **)(uVar11 + 0x28);
        }
        else {
          pAVar12 = (Aig_Obj_t *)(*(ulong *)((uVar11 & 0xfffffffffffffffe) + 0x28) ^ 1);
        }
        pAVar12 = Aig_Or(p,pAVar12,pAVar16);
        if ((int)__ptr[1] <= lVar22) goto LAB_005b032d;
        pAVar13 = Aig_And(p,pAVar7,*(Aig_Obj_t **)(*(long *)(__ptr + 2) + lVar22 * 8));
        pAVar13 = Aig_Or(p,(Aig_Obj_t *)((ulong)pAVar13 ^ 1),pAVar12);
        pAVar13 = Aig_And(p,pAVar13,local_50);
        uVar4 = __ptr_01[1];
        uVar3 = *__ptr_01;
        if (uVar4 == uVar3) {
          if ((int)uVar3 < 0x10) {
            if (*(void **)(__ptr_01 + 2) == (void *)0x0) {
              pvVar8 = malloc(0x80);
            }
            else {
              pvVar8 = realloc(*(void **)(__ptr_01 + 2),0x80);
            }
            uVar15 = 0x10;
          }
          else {
            uVar15 = uVar3 * 2;
            if ((int)uVar15 <= (int)uVar3) goto LAB_005b0048;
            if (*(void **)(__ptr_01 + 2) == (void *)0x0) {
              pvVar8 = malloc((ulong)uVar3 << 4);
            }
            else {
              pvVar8 = realloc(*(void **)(__ptr_01 + 2),(ulong)uVar3 << 4);
            }
          }
          *(void **)(__ptr_01 + 2) = pvVar8;
          *__ptr_01 = uVar15;
        }
LAB_005b0048:
        __ptr_01[1] = uVar4 + 1;
        *(Aig_Obj_t **)(*(long *)(__ptr_01 + 2) + (long)(int)uVar4 * 8) = pAVar12;
        uVar4 = __ptr_00[1];
        uVar3 = *__ptr_00;
        if (uVar4 == uVar3) {
          if ((int)uVar3 < 0x10) {
            if (*(void **)(__ptr_00 + 2) == (void *)0x0) {
              pvVar8 = malloc(0x80);
            }
            else {
              pvVar8 = realloc(*(void **)(__ptr_00 + 2),0x80);
            }
            uVar15 = 0x10;
          }
          else {
            uVar15 = uVar3 * 2;
            if ((int)uVar15 <= (int)uVar3) goto LAB_005b00dd;
            if (*(void **)(__ptr_00 + 2) == (void *)0x0) {
              pvVar8 = malloc((ulong)uVar3 << 4);
            }
            else {
              pvVar8 = realloc(*(void **)(__ptr_00 + 2),(ulong)uVar3 << 4);
            }
          }
          *(void **)(__ptr_00 + 2) = pvVar8;
          *__ptr_00 = uVar15;
        }
LAB_005b00dd:
        __ptr_00[1] = uVar4 + 1;
        *(Aig_Obj_t **)(*(long *)(__ptr_00 + 2) + (long)(int)uVar4 * 8) = pAVar13;
        lVar22 = lVar22 + 1;
      } while (lVar22 < pVVar1->nSize);
    }
    if (pAig->nTruePos < 1) {
      lVar22 = 0;
    }
    else {
      lVar22 = 0;
      do {
        if (pAig->vCos->nSize <= lVar22) goto LAB_005b032d;
        pvVar8 = pAig->vCos->pArray[lVar22];
        if (((ulong)pvVar8 & 1) != 0) goto LAB_005b034c;
        uVar11 = *(ulong *)((long)pvVar8 + 8) & 0xfffffffffffffffe;
        if (uVar11 == 0) {
          pAVar7 = (Aig_Obj_t *)0x0;
        }
        else {
          pAVar7 = (Aig_Obj_t *)
                   ((ulong)((uint)*(ulong *)((long)pvVar8 + 8) & 1) ^ *(ulong *)(uVar11 + 0x28));
        }
        pAVar7 = Aig_ObjCreateCo(p,pAVar7);
        *(Aig_Obj_t **)((long)pvVar8 + 0x28) = pAVar7;
        lVar22 = lVar22 + 1;
      } while (lVar22 < pAig->nTruePos);
    }
    *startMonotonePropPo = (int)lVar22;
    uVar4 = __ptr_00[1];
    if (0 < (long)(int)uVar4) {
      lVar22 = *(long *)(__ptr_00 + 2);
      lVar19 = 0;
      do {
        Aig_ObjCreateCo(p,*(Aig_Obj_t **)(lVar22 + lVar19 * 8));
        lVar19 = lVar19 + 1;
      } while ((int)uVar4 != lVar19);
    }
    if (pAig->nRegs < 1) {
      iVar17 = 0;
    }
    else {
      iVar17 = 0;
      do {
        uVar4 = pAig->nTruePos + iVar17;
        if (((int)uVar4 < 0) || (pAig->vCos->nSize <= (int)uVar4)) goto LAB_005b032d;
        pvVar8 = pAig->vCos->pArray[uVar4];
        if (((ulong)pvVar8 & 1) != 0) {
LAB_005b034c:
          __assert_fail("!Aig_IsComplement(pObj)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aig.h"
                        ,0x138,"Aig_Obj_t *Aig_ObjChild0Copy(Aig_Obj_t *)");
        }
        uVar11 = *(ulong *)((long)pvVar8 + 8);
        uVar14 = uVar11 & 0xfffffffffffffffe;
        if (uVar14 == 0) {
          pAVar7 = (Aig_Obj_t *)0x0;
        }
        else {
          pAVar7 = (Aig_Obj_t *)((ulong)((uint)uVar11 & 1) ^ *(ulong *)(uVar14 + 0x28));
        }
        iVar17 = iVar17 + 1;
        Aig_ObjCreateCo(p,pAVar7);
      } while (iVar17 < pAig->nRegs);
    }
    Aig_ObjCreateCo(p,pAVar9);
    uVar4 = __ptr_01[1];
    if ((long)(int)uVar4 < 1) {
      iVar20 = 1;
    }
    else {
      lVar22 = *(long *)(__ptr_01 + 2);
      lVar19 = 0;
      do {
        Aig_ObjCreateCo(p,*(Aig_Obj_t **)(lVar22 + lVar19 * 8));
        lVar19 = lVar19 + 1;
      } while ((int)uVar4 != lVar19);
      iVar20 = uVar4 + 1;
    }
    Aig_ManSetRegNum(p,local_74 + iVar18);
    Aig_ManCleanup(p);
    iVar5 = Aig_ManCheck(p);
    if (iVar5 == 0) {
      __assert_fail("Aig_ManCheck( pNewAig )",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/live/disjunctiveMonotone.c"
                    ,0x10a,
                    "Aig_Man_t *createDisjunctiveMonotoneTester(Aig_Man_t *, struct aigPoIndices *, struct antecedentConsequentVectorsStruct *, int *)"
                   );
    }
    if (local_74 + iVar18 != iVar20 + iVar17) {
      __assert_fail("loCopied + loCreated == liCopied + liCreated",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/live/disjunctiveMonotone.c"
                    ,0x10b,
                    "Aig_Man_t *createDisjunctiveMonotoneTester(Aig_Man_t *, struct aigPoIndices *, struct antecedentConsequentVectorsStruct *, int *)"
                   );
    }
    if (*(void **)(__ptr + 2) != (void *)0x0) {
      free(*(void **)(__ptr + 2));
      __ptr[2] = 0;
      __ptr[3] = 0;
    }
    free(__ptr);
    if (*(void **)(__ptr_00 + 2) != (void *)0x0) {
      free(*(void **)(__ptr_00 + 2));
      __ptr_00[2] = 0;
      __ptr_00[3] = 0;
    }
    free(__ptr_00);
    if (*(void **)(__ptr_01 + 2) != (void *)0x0) {
      free(*(void **)(__ptr_01 + 2));
      __ptr_01[2] = 0;
      __ptr_01[3] = 0;
    }
    free(__ptr_01);
  }
  return p;
}

Assistant:

Aig_Man_t *createDisjunctiveMonotoneTester(Aig_Man_t *pAig, struct aigPoIndices *aigPoIndicesArg, 
					struct antecedentConsequentVectorsStruct *anteConseVectors, int *startMonotonePropPo)
{
	Aig_Man_t *pNewAig;
	int iElem, i, nRegCount;
	int piCopied = 0, liCopied = 0, liCreated = 0, loCopied = 0, loCreated = 0;
	int poCopied = 0, poCreated = 0;
	Aig_Obj_t *pObj, *pObjPo, *pObjDriver, *pObjDriverNew, *pObjPendingDriverNew, *pObjPendingAndNextPending;
	Aig_Obj_t *pPendingFlop, *pObjConseCandFlop, *pObjSafetyInvariantPoDriver;
	//Vec_Ptr_t *vHintMonotoneLocalDriverNew;
	Vec_Ptr_t *vConseCandFlopOutput;
	//Vec_Ptr_t *vHintMonotoneLocalProp;

	Aig_Obj_t *pObjAnteDisjunction, *pObjConsecDriver, *pObjConsecDriverNew, *pObjCandMonotone, *pObjPrevCandMonotone, *pObjMonotonePropDriver;
	Vec_Ptr_t *vCandMonotoneProp;
	Vec_Ptr_t *vCandMonotoneFlopInput;

	int pendingSignalIndexLocal = aigPoIndicesArg->attrPendingSignalIndex;

	Vec_Int_t *vAntecedentsLocal = anteConseVectors->attrAntecedents;
	Vec_Int_t *vConsequentCandidatesLocal = anteConseVectors->attrConsequentCandidates;

	if( vConsequentCandidatesLocal == NULL )
		return NULL; //no candidates for consequent is provided, hence no need to generate a new AIG

	
	//****************************************************************
	// Step1: create the new manager
	// Note: The new manager is created with "2 * Aig_ManObjNumMax(p)"
	// nodes, but this selection is arbitrary - need to be justified
	//****************************************************************
	pNewAig = Aig_ManStart( Aig_ManObjNumMax(pAig) );
	pNewAig->pName = (char *)malloc( strlen( pAig->pName ) + strlen("_monotone") + 2 );
	sprintf(pNewAig->pName, "%s_%s", pAig->pName, "monotone");
    	pNewAig->pSpec = NULL;

	//****************************************************************
	// Step 2: map constant nodes
	//****************************************************************
    	pObj = Aig_ManConst1( pAig );
    	pObj->pData = Aig_ManConst1( pNewAig );

	//****************************************************************
    	// Step 3: create true PIs
	//****************************************************************
    	Saig_ManForEachPi( pAig, pObj, i )
	{
		piCopied++;
		pObj->pData = Aig_ObjCreateCi(pNewAig);
	}

	//****************************************************************
	// Step 5: create register outputs
	//****************************************************************
    	Saig_ManForEachLo( pAig, pObj, i )
    	{
		loCopied++;
		pObj->pData = Aig_ObjCreateCi(pNewAig);
    	}

	//****************************************************************
	// Step 6: create "D" register output for PENDING flop 
	//****************************************************************
	loCreated++;
	pPendingFlop = Aig_ObjCreateCi( pNewAig );

	//****************************************************************
	// Step 6.a: create "D" register output for HINT_MONOTONE flop 
	//****************************************************************
	vConseCandFlopOutput = Vec_PtrAlloc(Vec_IntSize(vConsequentCandidatesLocal));
	Vec_IntForEachEntry( vConsequentCandidatesLocal, iElem, i )
	{
		loCreated++;
		pObjConseCandFlop = Aig_ObjCreateCi( pNewAig );
		Vec_PtrPush( vConseCandFlopOutput, pObjConseCandFlop );
	}

	nRegCount = loCreated + loCopied;

	//********************************************************************
	// Step 7: create internal nodes
	//********************************************************************
    	Aig_ManForEachNode( pAig, pObj, i )
	{
		pObj->pData = Aig_And( pNewAig, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
	}
	
	//********************************************************************
	// Step 8: mapping appropriate new flop drivers 
	//********************************************************************

	if( aigPoIndicesArg->attrSafetyInvarIndex != -1 )
	{
		pObjPo = Aig_ManCo( pAig, aigPoIndicesArg->attrSafetyInvarIndex );
		pObjDriver = Aig_NotCond((Aig_Obj_t *)Aig_ObjFanin0(pObjPo), Aig_ObjFaninC0(pObjPo));
		pObjDriverNew = !Aig_IsComplement(pObjDriver)? 
				(Aig_Obj_t *)(Aig_Regular(pObjDriver)->pData) : 
				Aig_Not((Aig_Obj_t *)(Aig_Regular(pObjDriver)->pData));
		pObjSafetyInvariantPoDriver = pObjDriverNew;
	}
	else
		pObjSafetyInvariantPoDriver = Aig_ManConst1(pNewAig);

	pObjPo = Aig_ManCo( pAig, pendingSignalIndexLocal );
	pObjDriver = Aig_NotCond((Aig_Obj_t *)Aig_ObjFanin0(pObjPo), Aig_ObjFaninC0(pObjPo));
	pObjPendingDriverNew = !Aig_IsComplement(pObjDriver)? 
				(Aig_Obj_t *)(Aig_Regular(pObjDriver)->pData) : 
				Aig_Not((Aig_Obj_t *)(Aig_Regular(pObjDriver)->pData));

	pObjPendingAndNextPending = Aig_And( pNewAig, pObjPendingDriverNew, pPendingFlop );

	pObjAnteDisjunction = Aig_Not(Aig_ManConst1( pNewAig ));
	if( vAntecedentsLocal )
	{
		Vec_IntForEachEntry( vAntecedentsLocal, iElem, i )
		{
			pObjPo = Aig_ManCo( pAig, iElem );
			pObjDriver = Aig_NotCond((Aig_Obj_t *)Aig_ObjFanin0(pObjPo), Aig_ObjFaninC0(pObjPo));
			pObjDriverNew = !Aig_IsComplement(pObjDriver)? 
					(Aig_Obj_t *)(Aig_Regular(pObjDriver)->pData) : 
					Aig_Not((Aig_Obj_t *)(Aig_Regular(pObjDriver)->pData));

			pObjAnteDisjunction = Aig_Or( pNewAig, pObjDriverNew, pObjAnteDisjunction );
		}
	}

	vCandMonotoneProp = Vec_PtrAlloc( Vec_IntSize(vConsequentCandidatesLocal) );
	vCandMonotoneFlopInput = Vec_PtrAlloc( Vec_IntSize(vConsequentCandidatesLocal) );
	Vec_IntForEachEntry( vConsequentCandidatesLocal, iElem, i )
	{
		pObjPo = Aig_ManCo( pAig, iElem );
		pObjConsecDriver = Aig_NotCond((Aig_Obj_t *)Aig_ObjFanin0(pObjPo), Aig_ObjFaninC0(pObjPo));
		pObjConsecDriverNew = !Aig_IsComplement(pObjConsecDriver)? 
					(Aig_Obj_t *)(Aig_Regular(pObjConsecDriver)->pData) : 
					Aig_Not((Aig_Obj_t *)(Aig_Regular(pObjConsecDriver)->pData));

		pObjCandMonotone = Aig_Or( pNewAig, pObjConsecDriverNew, pObjAnteDisjunction );
		pObjPrevCandMonotone = (Aig_Obj_t *)(Vec_PtrEntry( vConseCandFlopOutput, i ));
		pObjMonotonePropDriver = Aig_Or( pNewAig, Aig_Not( Aig_And( pNewAig, pObjPendingAndNextPending, pObjPrevCandMonotone ) ), 
						pObjCandMonotone );

		//Conjunting safety invar
		pObjMonotonePropDriver = Aig_And( pNewAig, pObjMonotonePropDriver, pObjSafetyInvariantPoDriver );
						
		Vec_PtrPush( vCandMonotoneFlopInput, pObjCandMonotone );
		Vec_PtrPush( vCandMonotoneProp, pObjMonotonePropDriver );
	}

	//********************************************************************
	// Step 9: create primary outputs 
	//********************************************************************
	Saig_ManForEachPo( pAig, pObj, i )
	{
		poCopied++;
		pObj->pData = Aig_ObjCreateCo( pNewAig, Aig_ObjChild0Copy(pObj) ); 
	}

	*startMonotonePropPo = i;
	Vec_PtrForEachEntry( Aig_Obj_t *, vCandMonotoneProp, pObj, i )
	{
		poCreated++;
		pObjPo = Aig_ObjCreateCo( pNewAig, pObj ); 
	}

	//********************************************************************
	// Step 9: create latch inputs 
	//********************************************************************

	Saig_ManForEachLi( pAig, pObj, i )
	{
		liCopied++;
		Aig_ObjCreateCo( pNewAig, Aig_ObjChild0Copy(pObj) );
	}
	
	//********************************************************************
	// Step 9.a: create latch input for PENDING_FLOP
	//********************************************************************

	liCreated++;
	Aig_ObjCreateCo( pNewAig, pObjPendingDriverNew );

	//********************************************************************
	// Step 9.b: create latch input for MONOTONE_FLOP
	//********************************************************************

	Vec_PtrForEachEntry( Aig_Obj_t *, vCandMonotoneFlopInput, pObj, i )
	{
		liCreated++;
		Aig_ObjCreateCo( pNewAig, pObj );
	}

	Aig_ManSetRegNum( pNewAig, nRegCount );
	Aig_ManCleanup( pNewAig );
	
	assert( Aig_ManCheck( pNewAig ) );
	assert( loCopied + loCreated == liCopied + liCreated );

	Vec_PtrFree(vConseCandFlopOutput);
	Vec_PtrFree(vCandMonotoneProp);
	Vec_PtrFree(vCandMonotoneFlopInput);
	return pNewAig;
}